

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-write-fail.c
# Opt level: O0

void connect_cb(uv_connect_t *req,int status)

{
  uv_stream_t *puVar1;
  int iVar2;
  undefined1 auVar3 [16];
  uv_write_t *write_req;
  int iStack_10028;
  int r;
  int j;
  int i;
  uv_stream_t *stream;
  uv_buf_t send_bufs [4096];
  int status_local;
  uv_connect_t *req_local;
  
  puVar1 = connect_req.handle;
  if (req != &connect_req) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x76,"req == &connect_req");
    abort();
  }
  if (status != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x77,"status == 0");
    abort();
  }
  connect_cb_called = connect_cb_called + 1;
  for (r = 0; r < 3; r = r + 1) {
    for (iStack_10028 = 0; iStack_10028 < 0x1000; iStack_10028 = iStack_10028 + 1) {
      auVar3 = uv_buf_init(send_buffer + bytes_sent,0x2728);
      send_bufs[(long)iStack_10028 + -1].len = auVar3._0_8_;
      send_bufs[iStack_10028].base = auVar3._8_8_;
      bytes_sent = bytes_sent + 0x2728;
    }
    iVar2 = uv_write(write_reqs + r,puVar1,&stream,0x1000,write_cb);
    if (iVar2 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
              ,0x86,"r == 0");
      abort();
    }
  }
  iVar2 = uv_shutdown(&shutdown_req,puVar1,shutdown_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x8b,"r == 0");
    abort();
  }
  iVar2 = uv_read_start(puVar1,alloc_cb,read_cb);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-writealot.c"
            ,0x8f,"r == 0");
    abort();
  }
  return;
}

Assistant:

static void connect_cb(uv_connect_t* req, int status) {
  uv_buf_t buf;
  uv_stream_t* stream;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  stream = req->handle;
  connect_cb_called++;

  /* close the socket, the hard way */
  close_socket((uv_tcp_t*)stream);

  buf = uv_buf_init("hello\n", 6);
  r = uv_write(&write_req, stream, &buf, 1, write_cb);
  ASSERT(r == 0);
}